

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cRobustnessTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::RobustnessRobustBufferAccessBehavior::GetnUniformTest::iterate(GetnUniformTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  GLint GVar4;
  TestContext *pTVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar7;
  bool local_27a;
  bool local_274;
  bool local_272;
  bool local_26a;
  bool local_264;
  bool local_262;
  bool local_25a;
  bool local_253;
  bool local_251;
  GLuint local_208 [2];
  GLuint result4ui [4];
  GLint result3i [3];
  GLfloat result4f [4];
  allocator<char> local_1c9;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  string local_f8;
  string *local_d8;
  string *cs;
  Program program;
  undefined8 uStack_58;
  bool test_result;
  GLuint input4ui [4];
  GLint input3i [3];
  GLfloat input4f [4];
  Functions *gl;
  GetnUniformTest *this_local;
  undefined4 extraout_var_02;
  
  bVar1 = checkExtension((this->super_TestCase).m_context,"GL_KHR_robustness");
  if ((bVar1) &&
     (bVar1 = checkExtension((this->super_TestCase).m_context,"GL_KHR_robust_buffer_access_behavior"
                            ), bVar1)) {
    pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar6->_vptr_RenderContext[7])(pRVar6,"glGetnUniformfv");
    this->m_pGetnUniformfv = (PFNGLGETNUNIFORMFV)CONCAT44(extraout_var,iVar2);
    pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar6->_vptr_RenderContext[7])(pRVar6,"glGetnUniformiv");
    this->m_pGetnUniformiv = (PFNGLGETNUNIFORMIV)CONCAT44(extraout_var_00,iVar2);
    pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar6->_vptr_RenderContext[7])(pRVar6,"glGetnUniformuiv");
    this->m_pGetnUniformuiv = (PFNGLGETNUNIFORMUIV)CONCAT44(extraout_var_01,iVar2);
    if ((this->m_pGetnUniformfv == (PFNGLGETNUNIFORMFV)0x0) ||
       ((this->m_pGetnUniformiv == (PFNGLGETNUNIFORMIV)0x0 ||
        (this->m_pGetnUniformuiv == (PFNGLGETNUNIFORMUIV)0x0)))) {
      pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      tcu::TestContext::setTestResult
                (pTVar5,QP_TEST_RESULT_INTERNAL_ERROR,"Pointer to function glGetnUniform* is NULL.")
      ;
    }
    else {
      pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
      iVar2 = (*pRVar6->_vptr_RenderContext[3])();
      lVar7 = CONCAT44(extraout_var_02,iVar2);
      stack0xffffffffffffffc8 = 0x40accccd3f800000;
      input4ui[2] = 10;
      input4ui[3] = 0xffffffec;
      input3i[0] = -0x1e;
      uStack_58 = 0x140000000a;
      input4ui[0] = 0x1e;
      input4ui[1] = 0x28;
      program.m_context._7_1_ = 1;
      RobustnessRobustBufferAccessBehavior::Program::Program
                ((Program *)&cs,(this->super_TestCase).m_context);
      getComputeShader_abi_cxx11_(&local_f8,this);
      local_d8 = &local_f8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"",&local_129);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"",&local_151);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"",&local_179);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"",&local_1a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"",&local_1c9);
      RobustnessRobustBufferAccessBehavior::Program::Init
                ((Program *)&cs,&local_f8,&local_128,&local_150,&local_178,&local_1a0,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator(&local_1c9);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator(&local_1a1);
      std::__cxx11::string::~string((string *)&local_178);
      std::allocator<char>::~allocator(&local_179);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator(&local_151);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator(&local_129);
      RobustnessRobustBufferAccessBehavior::Program::Use((Program *)&cs);
      (**(code **)(lVar7 + 0x1138))((GLuint)cs,0xb,1,input3i + 2);
      dVar3 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar3,"ProgramUniform4fv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cRobustnessTests.cpp"
                      ,0x4d7);
      (**(code **)(lVar7 + 0x1108))((GLuint)cs,0xc,1,input4ui + 2);
      dVar3 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar3,"ProgramUniform3iv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cRobustnessTests.cpp"
                      ,0x4da);
      (**(code **)(lVar7 + 0x1158))((GLuint)cs,0xd,1,&stack0xffffffffffffffa8);
      dVar3 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar3,"ProgramUniform4uiv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cRobustnessTests.cpp"
                      ,0x4dd);
      (**(code **)(lVar7 + 0x528))(1,1);
      dVar3 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar3,"DispatchCompute",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cRobustnessTests.cpp"
                      ,0x4e0);
      (*this->m_pGetnUniformfv)((GLuint)cs,0xb,0x10,(GLfloat *)(result3i + 1));
      local_251 = false;
      if ((program.m_context._7_1_ & 1) != 0) {
        local_251 = verifyResult(this,input3i + 2,result3i + 1,0x10,"getnUniformfv [false negative]"
                                );
      }
      program.m_context._7_1_ = local_251;
      local_253 = false;
      if (local_251 != false) {
        GVar4 = (**(code **)(lVar7 + 0x800))();
        local_253 = verifyError(this,GVar4,0,"getnUniformfv [false negative]");
      }
      program.m_context._7_1_ = local_253;
      (*this->m_pGetnUniformfv)((GLuint)cs,0xb,0xc,(GLfloat *)(result3i + 1));
      local_25a = false;
      if ((program.m_context._7_1_ & 1) != 0) {
        GVar4 = (**(code **)(lVar7 + 0x800))();
        local_25a = verifyError(this,GVar4,0x502,"getnUniformfv [false positive]");
      }
      program.m_context._7_1_ = local_25a;
      (*this->m_pGetnUniformiv)((GLuint)cs,0xc,0xc,(GLint *)(result4ui + 3));
      local_262 = false;
      if ((program.m_context._7_1_ & 1) != 0) {
        local_262 = verifyResult(this,input4ui + 2,result4ui + 3,0xc,
                                 "getnUniformiv [false negative]");
      }
      program.m_context._7_1_ = local_262;
      local_264 = false;
      if (local_262 != false) {
        GVar4 = (**(code **)(lVar7 + 0x800))();
        local_264 = verifyError(this,GVar4,0,"getnUniformiv [false negative]");
      }
      program.m_context._7_1_ = local_264;
      (*this->m_pGetnUniformiv)((GLuint)cs,0xc,8,(GLint *)(result4ui + 3));
      local_26a = false;
      if ((program.m_context._7_1_ & 1) != 0) {
        GVar4 = (**(code **)(lVar7 + 0x800))();
        local_26a = verifyError(this,GVar4,0x502,"getnUniformiv [false positive]");
      }
      program.m_context._7_1_ = local_26a;
      (*this->m_pGetnUniformuiv)((GLuint)cs,0xd,0x10,local_208);
      local_272 = false;
      if ((program.m_context._7_1_ & 1) != 0) {
        local_272 = verifyResult(this,&stack0xffffffffffffffa8,local_208,0x10,
                                 "getnUniformuiv [false negative]");
      }
      program.m_context._7_1_ = local_272;
      local_274 = false;
      if (local_272 != false) {
        GVar4 = (**(code **)(lVar7 + 0x800))();
        local_274 = verifyError(this,GVar4,0,"getnUniformuiv [false negative]");
      }
      program.m_context._7_1_ = local_274;
      (*this->m_pGetnUniformuiv)((GLuint)cs,0xd,0xc,local_208);
      local_27a = false;
      if ((program.m_context._7_1_ & 1) != 0) {
        GVar4 = (**(code **)(lVar7 + 0x800))();
        local_27a = verifyError(this,GVar4,0x502,"getnUniformuiv [false positive]");
      }
      program.m_context._7_1_ = local_27a;
      if (local_27a == true) {
        pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        tcu::TestContext::setTestResult(pTVar5,QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        tcu::TestContext::setTestResult(pTVar5,QP_TEST_RESULT_FAIL,"Fail");
      }
      std::__cxx11::string::~string((string *)&local_f8);
      RobustnessRobustBufferAccessBehavior::Program::~Program((Program *)&cs);
    }
  }
  else {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar5,QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetnUniformTest::iterate()
{
	if (!checkExtension(m_context, "GL_KHR_robustness") ||
		!checkExtension(m_context, "GL_KHR_robust_buffer_access_behavior"))
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	m_pGetnUniformfv  = (PFNGLGETNUNIFORMFV)m_context.getRenderContext().getProcAddress("glGetnUniformfv");
	m_pGetnUniformiv  = (PFNGLGETNUNIFORMIV)m_context.getRenderContext().getProcAddress("glGetnUniformiv");
	m_pGetnUniformuiv = (PFNGLGETNUNIFORMUIV)m_context.getRenderContext().getProcAddress("glGetnUniformuiv");

	if ((DE_NULL == m_pGetnUniformfv) || (DE_NULL == m_pGetnUniformiv) || (DE_NULL == m_pGetnUniformuiv))
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_INTERNAL_ERROR,
												 "Pointer to function glGetnUniform* is NULL.");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	const GLfloat input4f[]  = { 1.0f, 5.4f, 3.14159f, 1.28f };
	const GLint   input3i[]  = { 10, -20, -30 };
	const GLuint  input4ui[] = { 10, 20, 30, 40 };

	/* Test result indicator */
	bool test_result = true;

	/* Iterate over all cases */
	Program program(m_context);

	/* Compute Shader */
	const std::string& cs = getComputeShader();

	/* Shaders initialization */
	program.Init(cs /* cs */, "" /* fs */, "" /* gs */, "" /* tcs */, "" /* tes */, "" /* vs */);
	program.Use();

	/* passing uniform values */
	gl.programUniform4fv(program.m_id, 11, 1, input4f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ProgramUniform4fv");

	gl.programUniform3iv(program.m_id, 12, 1, input3i);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ProgramUniform3iv");

	gl.programUniform4uiv(program.m_id, 13, 1, input4ui);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ProgramUniform4uiv");

	gl.dispatchCompute(1, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute");

	/* veryfing gfetnUniform error messages */
	GLfloat result4f[4];
	GLint   result3i[3];
	GLuint  result4ui[4];

	m_pGetnUniformfv(program.m_id, 11, sizeof(GLfloat) * 4, result4f);
	test_result = test_result &&
				  verifyResult((void*)input4f, (void*)result4f, sizeof(GLfloat) * 4, "getnUniformfv [false negative]");
	test_result = test_result && verifyError(gl.getError(), GL_NO_ERROR, "getnUniformfv [false negative]");

	m_pGetnUniformfv(program.m_id, 11, sizeof(GLfloat) * 3, result4f);
	test_result = test_result && verifyError(gl.getError(), GL_INVALID_OPERATION, "getnUniformfv [false positive]");

	m_pGetnUniformiv(program.m_id, 12, sizeof(GLint) * 3, result3i);
	test_result = test_result &&
				  verifyResult((void*)input3i, (void*)result3i, sizeof(GLint) * 3, "getnUniformiv [false negative]");
	test_result = test_result && verifyError(gl.getError(), GL_NO_ERROR, "getnUniformiv [false negative]");

	m_pGetnUniformiv(program.m_id, 12, sizeof(GLint) * 2, result3i);
	test_result = test_result && verifyError(gl.getError(), GL_INVALID_OPERATION, "getnUniformiv [false positive]");

	m_pGetnUniformuiv(program.m_id, 13, sizeof(GLuint) * 4, result4ui);
	test_result = test_result && verifyResult((void*)input4ui, (void*)result4ui, sizeof(GLuint) * 4,
											  "getnUniformuiv [false negative]");
	test_result = test_result && verifyError(gl.getError(), GL_NO_ERROR, "getnUniformuiv [false negative]");

	m_pGetnUniformuiv(program.m_id, 13, sizeof(GLuint) * 3, result4ui);
	test_result = test_result && verifyError(gl.getError(), GL_INVALID_OPERATION, "getnUniformuiv [false positive]");

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}